

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O3

_Bool duckdb_je_buf_writer_init
                (tsdn_t *tsdn,buf_writer_t *buf_writer,write_cb_t *write_cb,void *cbopaque,char *buf
                ,size_t buf_len)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  szind_t ind;
  write_cb_t *pwVar9;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  long lVar12;
  ulong uVar13;
  rtree_ctx_t *prVar14;
  size_t sVar15;
  uint uVar16;
  rtree_ctx_t local_1b0;
  
  pwVar9 = duckdb_je_malloc_message;
  if (duckdb_je_malloc_message == (write_cb_t *)0x0) {
    pwVar9 = duckdb_je_wrtmessage;
  }
  if (write_cb != (write_cb_t *)0x0) {
    pwVar9 = write_cb;
  }
  buf_writer->write_cb = pwVar9;
  buf_writer->cbopaque = cbopaque;
  if (buf == (char *)0x0) {
    if (buf_len < 0x1001) {
      ind = (szind_t)duckdb_je_sz_size2index_tab[buf_len + 7 >> 3];
    }
    else {
      ind = sz_size2index_compute(buf_len);
    }
    if (tsdn == (tsdn_t *)0x0) {
      buf = (char *)duckdb_je_arena_malloc_hard
                              ((tsdn_t *)0x0,(arena_t *)duckdb_je_arenas[0].repr,buf_len,ind,false,
                               buf_len < 0x3801);
      if (buf == (char *)0x0) goto LAB_01d5da0b;
      prVar14 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar14);
    }
    else {
      buf = (char *)duckdb_je_arena_malloc_hard
                              (tsdn,(arena_t *)duckdb_je_arenas[0].repr,buf_len,ind,false,
                               buf_len < 0x3801);
      if (buf == (char *)0x0) {
LAB_01d5da0b:
        buf_writer->buf = (char *)0x0;
        buf_writer->internal_buf = true;
        _Var8 = true;
        sVar15 = 0;
        goto LAB_01d5d9d8;
      }
      prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar16 = (uint)((ulong)buf >> 0x1e) & 0xf;
    uVar13 = (ulong)buf & 0xffffffffc0000000;
    uVar10 = (ulong)(uVar16 << 4);
    puVar2 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    uVar10 = *(ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    if (uVar10 == uVar13) {
      prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)buf >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar14->l2_cache[0].leafkey == uVar13) {
      prVar11 = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = uVar10;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar13;
      puVar2[1] = (ulong)prVar11;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x118;
      do {
        if (*(ulong *)((long)prVar14->cache + lVar12 + -8) == uVar13) {
          uVar6 = *(ulong *)((long)&prVar14->cache[0].leafkey + lVar12);
          puVar3 = (undefined8 *)((long)prVar14->cache + lVar12 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)prVar14->cache + lVar12 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(ulong *)((long)prVar14->cache + lVar12 + -0x18) = uVar10;
          *(ulong *)((long)(prVar14->cache + -1) + lVar12) = puVar2[1];
          *puVar2 = uVar13;
          puVar2[1] = uVar6;
          prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)buf >> 9) & 0x1ffff8) + uVar6);
          goto LAB_01d5d95e;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x188);
      prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                          (tsdn,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)buf,true,false
                          );
    }
LAB_01d5d95e:
    pvVar5 = duckdb_je_arenas
             [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
              0xfff].repr;
    if (tsdn == (tsdn_t *)0x0) {
      prVar14 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar14);
    }
    else {
      prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar10 = (ulong)(uVar16 << 4);
    puVar2 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    uVar10 = *(ulong *)((long)&prVar14->cache[0].leafkey + uVar10);
    if (uVar10 == uVar13) {
      prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)buf >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar14->l2_cache[0].leafkey == uVar13) {
      prVar11 = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = uVar10;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar13;
      puVar2[1] = (ulong)prVar11;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x118;
      do {
        if (*(ulong *)((long)prVar14->cache + lVar12 + -8) == uVar13) {
          uVar6 = *(ulong *)((long)&prVar14->cache[0].leafkey + lVar12);
          puVar3 = (undefined8 *)((long)prVar14->cache + lVar12 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)prVar14->cache + lVar12 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(ulong *)((long)prVar14->cache + lVar12 + -0x18) = uVar10;
          *(ulong *)((long)(prVar14->cache + -1) + lVar12) = puVar2[1];
          *puVar2 = uVar13;
          puVar2[1] = uVar6;
          prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)buf >> 9) & 0x1ffff8) + uVar6);
          goto LAB_01d5d9b3;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x188);
      prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                          (tsdn,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)buf,true,false
                          );
    }
LAB_01d5d9b3:
    LOCK();
    plVar1 = (long *)((long)pvVar5 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
    UNLOCK();
    _Var8 = true;
  }
  else {
    _Var8 = false;
  }
  buf_writer->buf = buf;
  buf_writer->internal_buf = _Var8;
  sVar15 = buf_len - 1;
  _Var8 = false;
LAB_01d5d9d8:
  buf_writer->buf_size = sVar15;
  buf_writer->buf_end = 0;
  return _Var8;
}

Assistant:

bool
buf_writer_init(tsdn_t *tsdn, buf_writer_t *buf_writer, write_cb_t *write_cb,
    void *cbopaque, char *buf, size_t buf_len) {
	if (write_cb != NULL) {
		buf_writer->write_cb = write_cb;
	} else {
		buf_writer->write_cb = je_malloc_message != NULL ?
		    je_malloc_message : wrtmessage;
	}
	buf_writer->cbopaque = cbopaque;
	assert(buf_len >= 2);
	if (buf != NULL) {
		buf_writer->buf = buf;
		buf_writer->internal_buf = false;
	} else {
		buf_writer->buf = buf_writer_allocate_internal_buf(tsdn,
		    buf_len);
		buf_writer->internal_buf = true;
	}
	if (buf_writer->buf != NULL) {
		buf_writer->buf_size = buf_len - 1; /* Allowing for '\0'. */
	} else {
		buf_writer->buf_size = 0;
	}
	buf_writer->buf_end = 0;
	buf_writer_assert(buf_writer);
	return buf_writer->buf == NULL;
}